

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_object.c
# Opt level: O0

value object_metadata(object obj)

{
  value pvVar1;
  value *ppvVar2;
  value *f_map;
  value f;
  value name;
  value in_stack_00000050;
  size_t in_stack_ffffffffffffffd8;
  value *in_stack_ffffffffffffffe0;
  object in_stack_ffffffffffffffe8;
  undefined8 local_8;
  
  pvVar1 = object_metadata_name(in_stack_ffffffffffffffe8);
  if (pvVar1 == (value)0x0) {
    local_8 = (value)0x0;
  }
  else {
    local_8 = value_create_map(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    if (local_8 == (value)0x0) {
      value_type_destroy(in_stack_00000050);
      local_8 = (value)0x0;
    }
    else {
      ppvVar2 = value_to_map((value)0x1277a5);
      *ppvVar2 = pvVar1;
    }
  }
  return local_8;
}

Assistant:

value object_metadata(object obj)
{
	value name, f;

	value *f_map;

	/* Create object name array */
	name = object_metadata_name(obj);

	if (name == NULL)
	{
		return NULL;
	}

	/* Create object map (name) */
	f = value_create_map(NULL, 1);

	if (f == NULL)
	{
		value_type_destroy(name);

		return NULL;
	}

	f_map = value_to_map(f);

	f_map[0] = name;

	return f;
}